

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O0

int stbrp__skyline_find_min_y(stbrp_context *c,stbrp_node *first,int x0,int width,int *pwaste)

{
  int iVar1;
  int under_width;
  int waste_area;
  int visited_width;
  int min_y;
  int x1;
  stbrp_node *node;
  int *pwaste_local;
  int width_local;
  int x0_local;
  stbrp_node *first_local;
  stbrp_context *c_local;
  
  min_y = 0;
  waste_area = 0;
  visited_width = 0;
  for (node = first; (int)(uint)node->x < x0 + width; node = node->next) {
    if ((uint)min_y < (uint)node->y) {
      iVar1 = visited_width * ((uint)node->y - min_y);
      min_y = (int)node->y;
      if ((int)(uint)node->x < x0) {
        under_width = (uint)node->next->x - x0;
      }
      else {
        under_width = (uint)node->next->x - (uint)node->x;
      }
    }
    else {
      under_width = (uint)node->next->x - (uint)node->x;
      if (width < under_width + visited_width) {
        under_width = width - visited_width;
      }
      iVar1 = under_width * (min_y - (uint)node->y);
    }
    visited_width = under_width + visited_width;
    waste_area = iVar1 + waste_area;
  }
  *pwaste = waste_area;
  return min_y;
}

Assistant:

static int stbrp__skyline_find_min_y(stbrp_context *c, stbrp_node *first, int x0, int width, int *pwaste)
{
   stbrp_node *node = first;
   int x1 = x0 + width;
   int min_y, visited_width, waste_area;

   STBRP__NOTUSED(c);

   STBRP_ASSERT(first->x <= x0);

   #if 0
   // skip in case we're past the node
   while (node->next->x <= x0)
      ++node;
   #else
   STBRP_ASSERT(node->next->x > x0); // we ended up handling this in the caller for efficiency
   #endif

   STBRP_ASSERT(node->x <= x0);

   min_y = 0;
   waste_area = 0;
   visited_width = 0;
   while (node->x < x1) {
      if (node->y > min_y) {
         // raise min_y higher.
         // we've accounted for all waste up to min_y,
         // but we'll now add more waste for everything we've visted
         waste_area += visited_width * (node->y - min_y);
         min_y = node->y;
         // the first time through, visited_width might be reduced
         if (node->x < x0)
            visited_width += node->next->x - x0;
         else
            visited_width += node->next->x - node->x;
      } else {
         // add waste area
         int under_width = node->next->x - node->x;
         if (under_width + visited_width > width)
            under_width = width - visited_width;
         waste_area += under_width * (min_y - node->y);
         visited_width += under_width;
      }
      node = node->next;
   }

   *pwaste = waste_area;
   return min_y;
}